

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

basic_message<char> * __thiscall
booster::locale::basic_message<char>::operator=
          (basic_message<char> *this,basic_message<char> *other)

{
  basic_message<char> tmp;
  basic_message<char> local_90;
  
  if (this != other) {
    basic_message(&local_90,other);
    swap(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.plural_._M_dataplus._M_p != &local_90.plural_.field_2) {
      operator_delete(local_90.plural_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.context_._M_dataplus._M_p != &local_90.context_.field_2) {
      operator_delete(local_90.context_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.id_._M_dataplus._M_p != &local_90.id_.field_2) {
      operator_delete(local_90.id_._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

basic_message const &operator=(basic_message const &other)
            {
                if(this==&other) {
                    return *this;
                }
                basic_message tmp(other);
                swap(tmp);
                return *this;
            }